

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KdTree.cc
# Opt level: O2

void __thiscall
RVO::KdTree::queryAgentTreeRecursive(KdTree *this,Agent *agent,float *rangeSq,size_t node)

{
  size_t node_00;
  size_t *psVar1;
  pointer pAVar2;
  size_t i;
  size_t sVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  float fVar7;
  float fVar9;
  undefined1 auVar8 [16];
  
  pAVar2 = (this->agentTree_).
           super__Vector_base<RVO::KdTree::AgentTreeNode,_std::allocator<RVO::KdTree::AgentTreeNode>_>
           ._M_impl.super__Vector_impl_data._M_start;
  do {
    sVar3 = pAVar2[node].begin;
    if (pAVar2[node].end - sVar3 < 0xb) {
      for (; sVar3 < pAVar2[node].end; sVar3 = sVar3 + 1) {
        Agent::insertAgentNeighbor
                  (agent,(this->agents_).
                         super__Vector_base<RVO::Agent_*,_std::allocator<RVO::Agent_*>_>._M_impl.
                         super__Vector_impl_data._M_start[sVar3],rangeSq);
        pAVar2 = (this->agentTree_).
                 super__Vector_base<RVO::KdTree::AgentTreeNode,_std::allocator<RVO::KdTree::AgentTreeNode>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      }
      return;
    }
    sVar3 = pAVar2[node].left;
    node_00 = pAVar2[node].right;
    fVar7 = (agent->position_).x_;
    fVar9 = (agent->position_).y_;
    auVar5._0_4_ = pAVar2[sVar3].minX - fVar7;
    auVar5._4_4_ = pAVar2[node_00].minX - fVar7;
    auVar5._8_4_ = 0.0 - fVar7;
    auVar5._12_4_ = 0.0 - fVar7;
    auVar5 = maxps(auVar5,ZEXT816(0));
    auVar6._0_4_ = fVar7 - pAVar2[sVar3].maxX;
    auVar6._4_4_ = fVar7 - pAVar2[node_00].maxX;
    auVar6._8_4_ = fVar7 - 0.0;
    auVar6._12_4_ = fVar7 - 0.0;
    auVar6 = maxps(auVar6,ZEXT816(0));
    auVar4._0_4_ = pAVar2[sVar3].minY - fVar9;
    auVar4._4_4_ = pAVar2[node_00].minY - fVar9;
    auVar4._8_4_ = 0.0 - fVar9;
    auVar4._12_4_ = 0.0 - fVar9;
    auVar4 = maxps(auVar4,ZEXT816(0));
    auVar8._0_4_ = fVar9 - pAVar2[sVar3].maxY;
    auVar8._4_4_ = fVar9 - pAVar2[node_00].maxY;
    auVar8._8_4_ = fVar9 - 0.0;
    auVar8._12_4_ = fVar9 - 0.0;
    auVar8 = maxps(auVar8,ZEXT816(0));
    fVar7 = auVar8._0_4_ * auVar8._0_4_ +
            auVar4._0_4_ * auVar4._0_4_ + auVar5._0_4_ * auVar5._0_4_ + auVar6._0_4_ * auVar6._0_4_;
    fVar9 = auVar8._4_4_ * auVar8._4_4_ +
            auVar4._4_4_ * auVar4._4_4_ + auVar5._4_4_ * auVar5._4_4_ + auVar6._4_4_ * auVar6._4_4_;
    if (fVar9 <= fVar7) {
      if (*rangeSq <= fVar9) {
        return;
      }
      queryAgentTreeRecursive(this,agent,rangeSq,node_00);
      if (*rangeSq <= fVar7) {
        return;
      }
      pAVar2 = (this->agentTree_).
               super__Vector_base<RVO::KdTree::AgentTreeNode,_std::allocator<RVO::KdTree::AgentTreeNode>_>
               ._M_impl.super__Vector_impl_data._M_start;
      psVar1 = &pAVar2[node].left;
    }
    else {
      if (*rangeSq <= fVar7) {
        return;
      }
      queryAgentTreeRecursive(this,agent,rangeSq,sVar3);
      if (*rangeSq <= fVar9) {
        return;
      }
      pAVar2 = (this->agentTree_).
               super__Vector_base<RVO::KdTree::AgentTreeNode,_std::allocator<RVO::KdTree::AgentTreeNode>_>
               ._M_impl.super__Vector_impl_data._M_start;
      psVar1 = &pAVar2[node].right;
    }
    node = *psVar1;
  } while( true );
}

Assistant:

void KdTree::queryAgentTreeRecursive(Agent *agent, float &rangeSq,
                                     std::size_t node) const {
  if (agentTree_[node].end - agentTree_[node].begin <= RVO_MAX_LEAF_SIZE) {
    for (std::size_t i = agentTree_[node].begin; i < agentTree_[node].end;
         ++i) {
      agent->insertAgentNeighbor(agents_[i], rangeSq);
    }
  } else {
    const float distLeftMinX = std::max(
        0.0F, agentTree_[agentTree_[node].left].minX - agent->position_.x());
    const float distLeftMaxX = std::max(
        0.0F, agent->position_.x() - agentTree_[agentTree_[node].left].maxX);
    const float distLeftMinY = std::max(
        0.0F, agentTree_[agentTree_[node].left].minY - agent->position_.y());
    const float distLeftMaxY = std::max(
        0.0F, agent->position_.y() - agentTree_[agentTree_[node].left].maxY);

    const float distSqLeft =
        distLeftMinX * distLeftMinX + distLeftMaxX * distLeftMaxX +
        distLeftMinY * distLeftMinY + distLeftMaxY * distLeftMaxY;

    const float distRightMinX = std::max(
        0.0F, agentTree_[agentTree_[node].right].minX - agent->position_.x());
    const float distRightMaxX = std::max(
        0.0F, agent->position_.x() - agentTree_[agentTree_[node].right].maxX);
    const float distRightMinY = std::max(
        0.0F, agentTree_[agentTree_[node].right].minY - agent->position_.y());
    const float distRightMaxY = std::max(
        0.0F, agent->position_.y() - agentTree_[agentTree_[node].right].maxY);

    const float distSqRight =
        distRightMinX * distRightMinX + distRightMaxX * distRightMaxX +
        distRightMinY * distRightMinY + distRightMaxY * distRightMaxY;

    if (distSqLeft < distSqRight) {
      if (distSqLeft < rangeSq) {
        queryAgentTreeRecursive(agent, rangeSq, agentTree_[node].left);

        if (distSqRight < rangeSq) {
          queryAgentTreeRecursive(agent, rangeSq, agentTree_[node].right);
        }
      }
    } else if (distSqRight < rangeSq) {
      queryAgentTreeRecursive(agent, rangeSq, agentTree_[node].right);

      if (distSqLeft < rangeSq) {
        queryAgentTreeRecursive(agent, rangeSq, agentTree_[node].left);
      }
    }
  }
}